

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_fe_mul(secp256k1_fe *a,secp256k1_fe *b,int use_sqr)

{
  int in_EDX;
  void *in_RSI;
  void *in_RDI;
  int i;
  uint16_t t16 [32];
  uint16_t c16 [16];
  uint16_t b16 [16];
  uint16_t a16 [16];
  uchar c32 [32];
  uchar b32 [32];
  uchar a32 [32];
  secp256k1_fe bn;
  secp256k1_fe an;
  secp256k1_fe c;
  secp256k1_fe *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  int iVar1;
  undefined1 local_1a8 [64];
  short local_168 [16];
  short local_148 [16];
  short local_128 [16];
  byte local_108 [16];
  uint16_t *in_stack_ffffffffffffff08;
  uint16_t *in_stack_ffffffffffffff10;
  uint16_t *in_stack_ffffffffffffff18;
  uint16_t *in_stack_ffffffffffffff20;
  byte local_c8 [80];
  undefined1 local_78 [48];
  undefined1 local_48 [52];
  int local_14;
  void *local_10;
  void *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(local_48,in_RDI,0x30);
  if (local_14 == 0) {
    secp256k1_fe_mul((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     in_stack_fffffffffffffe48,(secp256k1_fe *)0x14011c);
  }
  else {
    secp256k1_fe_sqr((secp256k1_fe *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                     in_stack_fffffffffffffe48);
  }
  memcpy(local_78,local_8,0x30);
  memcpy(local_c8 + 0x20,local_10,0x30);
  secp256k1_fe_normalize_var((secp256k1_fe *)0x14015d);
  secp256k1_fe_normalize_var((secp256k1_fe *)0x14016a);
  secp256k1_fe_normalize_var((secp256k1_fe *)0x140177);
  secp256k1_fe_get_b32
            ((uchar *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  secp256k1_fe_get_b32
            ((uchar *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  secp256k1_fe_get_b32
            ((uchar *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  for (iVar1 = 0; iVar1 < 0x10; iVar1 = iVar1 + 1) {
    local_128[iVar1] =
         (ushort)local_c8[iVar1 * -2 + 0x1f] + (ushort)local_c8[iVar1 * -2 + 0x1e] * 0x100;
    local_148[iVar1] =
         (ushort)local_c8[(long)(iVar1 * -2 + 0x1f) + -0x20] +
         (ushort)local_c8[(long)(iVar1 * -2 + 0x1e) + -0x20] * 0x100;
    local_168[iVar1] =
         (ushort)local_108[iVar1 * -2 + 0x1f] + (ushort)local_108[iVar1 * -2 + 0x1e] * 0x100;
  }
  mulmod256(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
            in_stack_ffffffffffffff08);
  iVar1 = secp256k1_memcmp_var(local_1a8,local_168,0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
            ,0xc4c,"test condition failed: secp256k1_memcmp_var(t16, c16, 32) == 0");
    abort();
  }
  return;
}

Assistant:

static void test_fe_mul(const secp256k1_fe* a, const secp256k1_fe* b, int use_sqr)
{
    secp256k1_fe c, an, bn;
    /* Variables in BE 32-byte format. */
    unsigned char a32[32], b32[32], c32[32];
    /* Variables in LE 16x uint16_t format. */
    uint16_t a16[16], b16[16], c16[16];
    /* Field modulus in LE 16x uint16_t format. */
    static const uint16_t m16[16] = {
        0xfc2f, 0xffff, 0xfffe, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
        0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff, 0xffff,
    };
    uint16_t t16[32];
    int i;

    /* Compute C = A * B in fe format. */
    c = *a;
    if (use_sqr) {
        secp256k1_fe_sqr(&c, &c);
    } else {
        secp256k1_fe_mul(&c, &c, b);
    }

    /* Convert A, B, C into LE 16x uint16_t format. */
    an = *a;
    bn = *b;
    secp256k1_fe_normalize_var(&c);
    secp256k1_fe_normalize_var(&an);
    secp256k1_fe_normalize_var(&bn);
    secp256k1_fe_get_b32(a32, &an);
    secp256k1_fe_get_b32(b32, &bn);
    secp256k1_fe_get_b32(c32, &c);
    for (i = 0; i < 16; ++i) {
        a16[i] = a32[31 - 2*i] + ((uint16_t)a32[30 - 2*i] << 8);
        b16[i] = b32[31 - 2*i] + ((uint16_t)b32[30 - 2*i] << 8);
        c16[i] = c32[31 - 2*i] + ((uint16_t)c32[30 - 2*i] << 8);
    }
    /* Compute T = A * B in LE 16x uint16_t format. */
    mulmod256(t16, a16, b16, m16);
    /* Compare */
    CHECK(secp256k1_memcmp_var(t16, c16, 32) == 0);
}